

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.hpp
# Opt level: O0

void * __thiscall cppjit::builder::builder::load_kernel(builder *this)

{
  undefined8 uVar1;
  void *pvVar2;
  char *pcVar3;
  cppjit_exception *pcVar4;
  string local_3e8 [32];
  stringstream local_3c8 [8];
  stringstream s_1;
  ostream local_3b8 [376];
  void *local_240;
  void *uncasted_function;
  string local_230 [32];
  stringstream local_210 [8];
  stringstream s;
  ostream local_200 [376];
  char *local_88;
  char *error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [8];
  string library_file;
  builder *this_local;
  
  if (this->kernel_library != (void *)0x0) {
    dlclose(this->kernel_library);
    this->kernel_library = (void *)0x0;
  }
  std::operator+(local_70,(char *)&this->compile_dir);
  std::operator+(local_50,local_70);
  std::operator+(local_30,(char *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)local_70);
  dlerror();
  uVar1 = std::__cxx11::string::c_str();
  pvVar2 = (void *)dlopen(uVar1,1);
  this->kernel_library = pvVar2;
  local_88 = (char *)dlerror();
  if (local_88 != (char *)0x0) {
    std::__cxx11::stringstream::stringstream(local_210);
    std::operator<<(local_200,"error: could not open kernel shared library file, reason: ");
    pcVar3 = (char *)dlerror();
    std::operator<<(local_200,pcVar3);
    uncasted_function._7_1_ = 1;
    pcVar4 = (cppjit_exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    cppjit_exception::cppjit_exception(pcVar4,local_230);
    uncasted_function._7_1_ = 0;
    __cxa_throw(pcVar4,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
  }
  dlerror();
  pvVar2 = this->kernel_library;
  uVar1 = std::__cxx11::string::c_str();
  local_240 = (void *)dlsym(pvVar2,uVar1);
  local_88 = (char *)dlerror();
  pvVar2 = local_240;
  if (local_88 != (char *)0x0) {
    std::__cxx11::stringstream::stringstream(local_3c8);
    std::operator<<(local_3b8,"error: could not find kernel symbol, reason: ");
    std::operator<<(local_3b8,local_88);
    pcVar4 = (cppjit_exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    cppjit_exception::cppjit_exception(pcVar4,local_3e8);
    __cxa_throw(pcVar4,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
  }
  std::__cxx11::string::~string((string *)local_30);
  return pvVar2;
}

Assistant:

void *load_kernel() {
    if (kernel_library) {
      dlclose(kernel_library);
      kernel_library = nullptr;
    }

    std::string library_file(compile_dir + "lib" + kernel_name + ".so");

    dlerror();  // clear any prior error
    kernel_library = dlopen(library_file.c_str(), RTLD_LAZY);
    char *error = dlerror();

    if (error != nullptr) {
      std::stringstream s;
      s << "error: could not open kernel shared library file, reason: ";
      s << dlerror();
      throw cppjit_exception(s.str());
    }

    dlerror();  // clear any prior error
    void *uncasted_function = dlsym(kernel_library, kernel_name.c_str());
    error = dlerror();

    if (error != nullptr) {
      std::stringstream s;
      s << "error: could not find kernel symbol, reason: ";
      s << error;
      throw cppjit_exception(s.str());
    }
    return uncasted_function;
  }